

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

void duckdb_re2::ConvertLatin1ToUTF8(StringPiece *latin1,string *utf)

{
  size_t i;
  ulong uVar1;
  Rune r;
  char buf [4];
  uint local_30;
  char local_2c [4];
  
  utf->_M_string_length = 0;
  *(utf->_M_dataplus)._M_p = '\0';
  for (uVar1 = 0; uVar1 < latin1->size_; uVar1 = uVar1 + 1) {
    local_30 = (uint)(byte)latin1->data_[uVar1];
    runetochar(local_2c,(Rune *)&local_30);
    std::__cxx11::string::append((char *)utf,(ulong)local_2c);
  }
  return;
}

Assistant:

void ConvertLatin1ToUTF8(const StringPiece& latin1, std::string* utf) {
  char buf[UTFmax];

  utf->clear();
  for (size_t i = 0; i < latin1.size(); i++) {
    Rune r = latin1[i] & 0xFF;
    int n = runetochar(buf, &r);
    utf->append(buf, n);
  }
}